

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O1

char * cert_expr_expression(CertExprBuilder *eb)

{
  strbuf *buf_o;
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  ptrlen pl;
  ptrlen pl_00;
  
  buf_o = strbuf_new();
  if (eb->nwcs != 0) {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        pl.len = 4;
        pl.ptr = " || ";
        BinarySink_put_datapl(buf_o->binarysink_,pl);
      }
      pcVar2 = eb->wcs[uVar3];
      sVar1 = strlen(pcVar2);
      pl_00.len = sVar1;
      pl_00.ptr = pcVar2;
      BinarySink_put_datapl(buf_o->binarysink_,pl_00);
      uVar3 = uVar3 + 1;
    } while (uVar3 < eb->nwcs);
  }
  pcVar2 = strbuf_to_str(buf_o);
  return pcVar2;
}

Assistant:

char *cert_expr_expression(CertExprBuilder *eb)
{
    strbuf *sb = strbuf_new();
    for (size_t i = 0; i < eb->nwcs; i++) {
        if (i)
            put_dataz(sb, " || ");
        put_dataz(sb, eb->wcs[i]);
    }
    return strbuf_to_str(sb);
}